

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_text.cpp
# Opt level: O0

void breakit(FBrokenLines *line,FFont *font,BYTE *start,BYTE *stop,FString *linecolor)

{
  bool bVar1;
  int iVar2;
  FString local_38;
  FString *local_30;
  FString *linecolor_local;
  BYTE *stop_local;
  BYTE *start_local;
  FFont *font_local;
  FBrokenLines *line_local;
  
  local_30 = linecolor;
  linecolor_local = (FString *)stop;
  stop_local = start;
  start_local = (BYTE *)font;
  font_local = (FFont *)line;
  bVar1 = FString::IsEmpty(linecolor);
  if (!bVar1) {
    FString::FString(&local_38,'\x1c');
    FString::operator=((FString *)&font_local->FirstChar,&local_38);
    FString::~FString(&local_38);
    FString::operator+=((FString *)&font_local->FirstChar,local_30);
  }
  FString::AppendCStrPart
            ((FString *)&font_local->FirstChar,(char *)stop_local,
             (long)linecolor_local - (long)stop_local);
  iVar2 = FFont::StringWidth((FFont *)start_local,(FString *)&font_local->FirstChar);
  *(int *)&font_local->_vptr_FFont = iVar2;
  return;
}

Assistant:

static void breakit (FBrokenLines *line, FFont *font, const BYTE *start, const BYTE *stop, FString &linecolor)
{
	if (!linecolor.IsEmpty())
	{
		line->Text = TEXTCOLOR_ESCAPE;
		line->Text += linecolor;
	}
	line->Text.AppendCStrPart ((const char *)start, stop - start);
	line->Width = font->StringWidth (line->Text);
}